

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

void Internal_TextStyleInit
               (wchar_t *name,ON_UUID id,int index,ON_Font *font,ON_TextStyle *text_style)

{
  bool bVar1;
  undefined1 local_50 [23];
  bool bLockName;
  ON_wString font_description;
  ON_TextStyle *text_style_local;
  ON_Font *font_local;
  ON_wString OStack_20;
  int index_local;
  wchar_t *name_local;
  ON_UUID id_local;
  
  font_description.m_s = (wchar_t *)text_style;
  ON_wString::ON_wString((ON_wString *)(local_50 + 0x10));
  local_50[0xf] = 0;
  OStack_20.m_s = name;
  if (font != (ON_Font *)0x0) {
    ON_Font::Description((ON_Font *)local_50);
    ON_wString::operator=((ON_wString *)(local_50 + 0x10),(ON_wString *)local_50);
    ON_wString::~ON_wString((ON_wString *)local_50);
    ON_TextStyle::SetFont((ON_TextStyle *)font_description.m_s,font);
    if (((name == (wchar_t *)0x0) || (*name == L'\0')) &&
       (bVar1 = ON_wString::IsNotEmpty((ON_wString *)(local_50 + 0x10)), bVar1)) {
      OStack_20.m_s = ON_wString::operator_cast_to_wchar_t_((ON_wString *)(local_50 + 0x10));
      local_50[0xf] = 1;
    }
  }
  Internal_SystemModelComponentInit
            (id,index,OStack_20.m_s,(ON_ModelComponent *)font_description.m_s);
  if ((local_50[0xf] & 1) != 0) {
    ON_ModelComponent::LockName((ON_ModelComponent *)font_description.m_s);
  }
  ON_wString::~ON_wString((ON_wString *)(local_50 + 0x10));
  return;
}

Assistant:

static void Internal_TextStyleInit(
  const wchar_t* name,
  ON_UUID id,
  int index,
  const ON_Font* font,
  ON_TextStyle& text_style
  )
{
  ON_wString font_description;
  bool bLockName = false;
  if (nullptr != font)
  {
    font_description = font->Description();
    text_style.SetFont(font);

    if ( (nullptr == name || 0 == name[0]) && font_description.IsNotEmpty() )
    {
      name = font_description;
      bLockName = true;
    }
  }

  Internal_SystemModelComponentInit(id, index, name, text_style);

  if (bLockName)
    text_style.LockName();
}